

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

char * cmsys::SystemTools::RemoveCharsButUpperHex(char *str)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (str != (char *)0x0) {
    sVar2 = strlen(str);
    pcVar3 = (char *)operator_new__(sVar2 + 1);
    pcVar4 = pcVar3;
    for (; cVar1 = *str, cVar1 != '\0'; str = str + 1) {
      if ((byte)(cVar1 - 0x30U) < 10 || (byte)(cVar1 + 0xbfU) < 6) {
        *pcVar4 = cVar1;
        pcVar4 = pcVar4 + 1;
      }
    }
    *pcVar4 = '\0';
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

char* SystemTools::RemoveCharsButUpperHex(const char* str)
{
  if (!str)
    {
    return 0;
    }
  char *clean_str = new char [strlen(str) + 1];
  char *ptr = clean_str;
  while (*str)
    {
    if ((*str >= '0' && *str <= '9') || (*str >= 'A' && *str <= 'F'))
      {
      *ptr++ = *str;
      }
    ++str;
    }
  *ptr = '\0';
  return clean_str;
}